

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::setTo(UnicodeString *this,UnicodeString *srcText,int32_t srcStart)

{
  short sVar1;
  short sVar2;
  UnicodeString *pUVar3;
  int32_t iVar4;
  int32_t length;
  int srcStart_00;
  int iVar5;
  
  unBogus(this);
  sVar1 = (srcText->fUnion).fStackFields.fLengthAndFlags;
  if (srcStart < 0) {
    iVar4 = (srcText->fUnion).fFields.fLength;
    iVar5 = (int)sVar1 >> 5;
    srcStart_00 = 0;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
    iVar4 = (srcText->fUnion).fFields.fLength;
    srcStart_00 = iVar5;
    if (sVar1 < 0) {
      srcStart_00 = iVar4;
    }
    if (srcStart <= srcStart_00) {
      srcStart_00 = srcStart;
    }
  }
  sVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    length = (this->fUnion).fFields.fLength;
  }
  else {
    length = (int)sVar2 >> 5;
  }
  if (sVar1 < 0) {
    iVar5 = iVar4;
  }
  pUVar3 = doReplace(this,0,length,srcText,srcStart_00,iVar5 - srcStart_00);
  return pUVar3;
}

Assistant:

inline UnicodeString&
UnicodeString::setTo(const UnicodeString& srcText,
             int32_t srcStart)
{
  unBogus();
  srcText.pinIndex(srcStart);
  return doReplace(0, length(), srcText, srcStart, srcText.length() - srcStart);
}